

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cursor.c
# Opt level: O1

int coda_cursor_get_file_bit_offset(coda_cursor *cursor,int64_t *bit_offset)

{
  coda_backend cVar1;
  coda_dynamic_type_struct *pcVar2;
  long lVar3;
  undefined8 uVar4;
  char *message;
  
  if ((cursor != (coda_cursor *)0x0) && (lVar3 = (long)cursor->n, 0 < lVar3)) {
    pcVar2 = cursor->stack[lVar3 - 1U & 0xffffffff].type;
    if (pcVar2 != (coda_dynamic_type_struct *)0x0) {
      if (bit_offset != (int64_t *)0x0) {
        cVar1 = pcVar2->backend;
        if (cVar1 - coda_backend_memory < 6) {
          *bit_offset = -1;
          return 0;
        }
        if (coda_backend_binary < cVar1) {
          return 0;
        }
        *bit_offset = cursor->stack[lVar3 + -1].bit_offset;
        return 0;
      }
      message = "bit_offset argument is NULL (%s:%u)";
      uVar4 = 0x72a;
      goto LAB_0012ea07;
    }
  }
  message = "invalid cursor argument (%s:%u)";
  uVar4 = 0x724;
LAB_0012ea07:
  coda_set_error(-100,message,
                 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor.c"
                 ,uVar4);
  return -1;
}

Assistant:

int coda_cursor_get_file_bit_offset(const coda_cursor *cursor, int64_t *bit_offset)
{
    if (cursor == NULL || cursor->n <= 0 || cursor->stack[cursor->n - 1].type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "invalid cursor argument (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    if (bit_offset == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "bit_offset argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    switch (cursor->stack[cursor->n - 1].type->backend)
    {
        case coda_backend_ascii:
        case coda_backend_binary:
            *bit_offset = cursor->stack[cursor->n - 1].bit_offset;
            break;
        case coda_backend_memory:
        case coda_backend_hdf4:
        case coda_backend_hdf5:
        case coda_backend_cdf:
        case coda_backend_netcdf:
        case coda_backend_grib:
            *bit_offset = -1;
            break;
    }

    return 0;
}